

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player-properties.c
# Opt level: O0

void gain_spec_display(menu_conflict *menu,int oid,_Bool cursor,int row,int col,int width)

{
  uint8_t attr_00;
  long *plVar1;
  player_ability *ppVar2;
  player_ability *ability;
  uint8_t attr;
  int idx;
  spec_menu_data *d;
  int width_local;
  int col_local;
  int row_local;
  _Bool cursor_local;
  int oid_local;
  menu_conflict *menu_local;
  
  plVar1 = (long *)menu_priv(menu);
  attr_00 = '\x05';
  if (cursor) {
    attr_00 = '\r';
  }
  ppVar2 = lookup_ability("player",*(int *)(*plVar1 + (long)oid * 4),0);
  c_put_str(attr_00,ppVar2->name,row,col);
  return;
}

Assistant:

static void gain_spec_display(struct menu *menu, int oid, bool cursor, int row,
					   int col, int width)
{
	struct spec_menu_data *d = menu_priv(menu);
	int idx = d->specialties[oid];
	uint8_t attr = (cursor ? COLOUR_L_GREEN : COLOUR_GREEN);
	struct player_ability *ability = lookup_ability("player", idx, 0);

	/* Print it */
	c_put_str(attr, ability->name, row, col);

}